

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int luv_new_udp(lua_State *L)

{
  int iVar1;
  uv_udp_t *handle_00;
  uv_loop_t *puVar2;
  lua_Integer lVar3;
  luv_handle_t *plVar4;
  int local_24;
  int ret;
  uv_udp_t *handle;
  lua_State *L_local;
  
  handle_00 = (uv_udp_t *)luv_newuserdata(L,0xd8);
  iVar1 = lua_type(L,1);
  if (iVar1 < 1) {
    puVar2 = luv_loop(L);
    local_24 = uv_udp_init(puVar2,handle_00);
  }
  else {
    puVar2 = luv_loop(L);
    lVar3 = lua_tointegerx(L,1,(int *)0x0);
    local_24 = uv_udp_init_ex(puVar2,handle_00,(uint)lVar3);
  }
  if (local_24 < 0) {
    lua_settop(L,-2);
    L_local._4_4_ = luv_error(L,local_24);
  }
  else {
    plVar4 = luv_setup_handle(L);
    handle_00->data = plVar4;
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int luv_new_udp(lua_State* L) {
  luv_ctx_t* ctx = luv_context(L);
  lua_settop(L, 1);
  uv_udp_t* handle = (uv_udp_t*)luv_newuserdata(L, sizeof(*handle));
  int ret;
  if (lua_isnoneornil(L, 1)) {
    ret = uv_udp_init(ctx->loop, handle);
  }
  else {
    unsigned int flags = AF_UNSPEC;
    if (lua_isnumber(L, 1)) {
      flags = lua_tointeger(L, 1);
    }
    else if (lua_isstring(L, 1)) {
      const char* family = lua_tostring(L, 1);
      flags = luv_af_string_to_num(family);
      if (!flags) {
        luaL_argerror(L, 1, lua_pushfstring(L, "invalid or unknown address family: '%s'", family));
      }
    }
    else {
      luaL_argerror(L, 1, "expected string or integer");
    }
    ret = uv_udp_init_ex(ctx->loop, handle, flags);
  }
  if (ret < 0) {
    lua_pop(L, 1);
    return luv_error(L, ret);
  }
  handle->data = luv_setup_handle(L, ctx);
  return 1;
}